

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O0

Index __thiscall MADPComponentFactoredStates::SampleInitialState(MADPComponentFactoredStates *this)

{
  Index IVar1;
  ostream *poVar2;
  undefined8 uVar3;
  long in_RDI;
  Index state;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sfacValues;
  stringstream ss;
  stringstream *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *sIs;
  MADPComponentFactoredStates *in_stack_fffffffffffffe20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1b8;
  stringstream local_190 [16];
  ostream local_180 [384];
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_190);
    poVar2 = std::operator<<(local_180,"MADPComponentFactoredStates::SampleInitialState()");
    poVar2 = std::operator<<(poVar2," - Error: not initialized. ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    uVar3 = __cxa_allocate_exception(0x28);
    E::E((E *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
         in_stack_fffffffffffffe08);
    __cxa_throw(uVar3,&E::typeinfo,E::~E);
  }
  sIs = &local_1b8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xafe654);
  SampleInitialState(in_stack_fffffffffffffe20,sIs);
  IVar1 = FactorValueIndicesToStateIndex
                    ((MADPComponentFactoredStates *)
                     CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffffe08);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe20);
  return IVar1;
}

Assistant:

Index MADPComponentFactoredStates::SampleInitialState() const
{
  if(!_m_initialized)
  {
    stringstream ss;
    ss << "MADPComponentFactoredStates::SampleInitialState()" <<
      " - Error: not initialized. " << endl;
    throw E(ss);
  }

  vector<Index> sfacValues;
  SampleInitialState(sfacValues);
  Index state = FactorValueIndicesToStateIndex(sfacValues);
  return(state);
}